

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

void __thiscall brynet::net::DataSocket::postDisConnect(DataSocket *this)

{
  bool bVar1;
  element_type *this_00;
  anon_class_8_1_8991fb9c local_38;
  USER_PROC local_30;
  DataSocket *local_10;
  DataSocket *this_local;
  
  local_10 = this;
  bVar1 = std::operator!=(&this->mEventLoop,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mEventLoop);
    local_38.this = this;
    std::function<void()>::function<brynet::net::DataSocket::postDisConnect()::__0,void>
              ((function<void()> *)&local_30,&local_38);
    EventLoop::pushAsyncProc(this_00,&local_30);
    std::function<void_()>::~function(&local_30);
  }
  return;
}

Assistant:

void DataSocket::postDisConnect()
{
    if (mEventLoop != nullptr)
    {
        mEventLoop->pushAsyncProc([=](){
            procCloseInLoop();
        });
    }
}